

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_type *psVar1;
  int *piVar2;
  long lVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar5;
  pointer psVar6;
  element_type *this_00;
  element_type *this_01;
  uint uVar7;
  long *plVar8;
  ostream *poVar9;
  long *plVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [8];
  ulong uVar14;
  uint uVar15;
  double extraout_XMM0_Qa;
  undefined1 auStack_b8 [8];
  vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_> cars;
  Auto *local_98;
  shared_ptr<SedanCar> myAuto;
  Auto *local_80;
  shared_ptr<Truck> myTruck;
  string __str;
  long local_40;
  long lStack_38;
  
  local_98 = (Auto *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<SedanCar,std::allocator<SedanCar>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&myAuto,(SedanCar **)&local_98,
             (allocator<SedanCar> *)((long)&__str.field_2 + 8));
  Auto::setNoOfPassengers(local_98,4);
  Auto::setTailLoad(local_98,101.5);
  (*local_98->_vptr_Auto[2])();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount,vsnprintf,
             0x148,"%f");
  plVar8 = (long *)std::__cxx11::string::replace
                             ((ulong)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount,0,(char *)0x0,0x104018);
  plVar10 = plVar8 + 2;
  if ((long *)*plVar8 == plVar10) {
    local_40 = *plVar10;
    lStack_38 = plVar8[3];
    __str.field_2._8_8_ = &local_40;
  }
  else {
    local_40 = *plVar10;
    __str.field_2._8_8_ = (long *)*plVar8;
  }
  lVar3 = plVar8[1];
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)__str.field_2._8_8_,lVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if ((long *)__str.field_2._8_8_ != &local_40) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  if (myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__str._M_string_length) {
    operator_delete(myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)
  {
    uVar12 = 0;
  }
  else {
    uVar12 = (ulong)((myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_Auto).noOfPassengers;
  }
  uVar14 = -uVar12;
  if (0 < (long)uVar12) {
    uVar14 = uVar12;
  }
  uVar15 = 1;
  if (9 < uVar14) {
    uVar11 = uVar14;
    uVar7 = 4;
    do {
      uVar15 = uVar7;
      if (uVar11 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_0010251c;
      }
      if (uVar11 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_0010251c;
      }
      if (uVar11 < 10000) goto LAB_0010251c;
      bVar5 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      uVar7 = uVar15 + 4;
    } while (bVar5);
    uVar15 = uVar15 + 1;
  }
LAB_0010251c:
  myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__str._M_string_length;
  std::__cxx11::string::_M_construct
            ((ulong)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (char)uVar15 - (char)((long)uVar12 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi - ((long)uVar12 >> 0x3f)),uVar15,uVar14);
  plVar8 = (long *)std::__cxx11::string::replace
                             ((ulong)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount,0,(char *)0x0,0x10403a);
  plVar10 = plVar8 + 2;
  if ((long *)*plVar8 == plVar10) {
    local_40 = *plVar10;
    lStack_38 = plVar8[3];
    __str.field_2._8_8_ = &local_40;
  }
  else {
    local_40 = *plVar10;
    __str.field_2._8_8_ = (long *)*plVar8;
  }
  psVar1 = &__str._M_string_length;
  lVar3 = plVar8[1];
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)__str.field_2._8_8_,lVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if ((long *)__str.field_2._8_8_ != &local_40) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  if (myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar1) {
    operator_delete(myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=======   Separator  ======== ",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_80 = (Auto *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Truck,std::allocator<Truck>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&myTruck,(Truck **)&local_80,
             (allocator<Truck> *)((long)&__str.field_2 + 8));
  Auto::setNoOfPassengers(local_80,2);
  Auto::setTailLoad(local_80,500.5);
  (*local_80->_vptr_Auto[2])();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount,vsnprintf,
             0x148,"%f");
  plVar8 = (long *)std::__cxx11::string::replace
                             ((ulong)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount,0,(char *)0x0,0x10406d);
  plVar10 = plVar8 + 2;
  if ((long *)*plVar8 == plVar10) {
    local_40 = *plVar10;
    lStack_38 = plVar8[3];
    __str.field_2._8_8_ = &local_40;
  }
  else {
    local_40 = *plVar10;
    __str.field_2._8_8_ = (long *)*plVar8;
  }
  lVar3 = plVar8[1];
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)__str.field_2._8_8_,lVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if ((long *)__str.field_2._8_8_ != &local_40) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  if (myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar1) {
    operator_delete(myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = (ulong)((myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_Auto).noOfPassengers;
  }
  uVar14 = -uVar12;
  if (0 < (long)uVar12) {
    uVar14 = uVar12;
  }
  uVar15 = 1;
  if (9 < uVar14) {
    uVar11 = uVar14;
    uVar7 = 4;
    do {
      uVar15 = uVar7;
      if (uVar11 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_001027db;
      }
      if (uVar11 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_001027db;
      }
      if (uVar11 < 10000) goto LAB_001027db;
      bVar5 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      uVar7 = uVar15 + 4;
    } while (bVar5);
    uVar15 = uVar15 + 1;
  }
LAB_001027db:
  myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar1;
  std::__cxx11::string::_M_construct
            ((ulong)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (char)uVar15 - (char)((long)uVar12 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi - ((long)uVar12 >> 0x3f)),uVar15,uVar14);
  plVar8 = (long *)std::__cxx11::string::replace
                             ((ulong)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount,0,(char *)0x0,0x10403a);
  plVar10 = plVar8 + 2;
  if ((long *)*plVar8 == plVar10) {
    local_40 = *plVar10;
    lStack_38 = plVar8[3];
    __str.field_2._8_8_ = &local_40;
  }
  else {
    local_40 = *plVar10;
    __str.field_2._8_8_ = (long *)*plVar8;
  }
  lVar3 = plVar8[1];
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)__str.field_2._8_8_,lVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if ((long *)__str.field_2._8_8_ != &local_40) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  if (myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__str._M_string_length) {
    operator_delete(myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=======   Separator  ======== ",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  this_00 = myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auStack_b8 = (undefined1  [8])0x0;
  cars.super__Vector_base<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cars.super__Vector_base<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __str.field_2._8_8_ = local_98;
  if (myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar2 = &((myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Auto).noOfPassengers;
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    else {
      piVar2 = &((myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Auto).noOfPassengers;
      *piVar2 = *piVar2 + 1;
    }
  }
  std::vector<std::shared_ptr<Auto>,std::allocator<std::shared_ptr<Auto>>>::
  emplace_back<std::shared_ptr<Auto>>
            ((vector<std::shared_ptr<Auto>,std::allocator<std::shared_ptr<Auto>>> *)auStack_b8,
             (shared_ptr<Auto> *)((long)&__str.field_2 + 8));
  if (this_00 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  this_01 = myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  __str.field_2._8_8_ = local_80;
  if (myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar2 = &((myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Auto)
                .noOfPassengers;
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    else {
      piVar2 = &((myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Auto)
                .noOfPassengers;
      *piVar2 = *piVar2 + 1;
    }
  }
  std::vector<std::shared_ptr<Auto>,std::allocator<std::shared_ptr<Auto>>>::
  emplace_back<std::shared_ptr<Auto>>
            ((vector<std::shared_ptr<Auto>,std::allocator<std::shared_ptr<Auto>>> *)auStack_b8,
             (shared_ptr<Auto> *)((long)&__str.field_2 + 8));
  if (this_01 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  psVar6 = cars.super__Vector_base<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (auStack_b8 ==
      (undefined1  [8])
      cars.super__Vector_base<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    auVar13 = auStack_b8;
    do {
      peVar4 = (((pointer)auVar13)->super___shared_ptr<Auto,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this = (((pointer)auVar13)->super___shared_ptr<Auto,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      (*peVar4->_vptr_Auto[2])();
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
           extraout_XMM0_Qa);
      auVar13 = (undefined1  [8])((long)auVar13 + 0x10);
    } while (auVar13 != (undefined1  [8])psVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Total weight of my cars are: ",0x1d);
  poVar9 = std::ostream::_M_insert<double>
                     ((double)myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=======   Separator  ======== ",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Now Objects have no references and are removed from memory automatically.",0x49);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=======   Separator  ======== ",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__str._M_string_length;
  if (myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)
  {
    uVar12 = 0;
  }
  else {
    uVar12 = (ulong)((myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_Auto).noOfPassengers;
  }
  uVar14 = -uVar12;
  if (0 < (long)uVar12) {
    uVar14 = uVar12;
  }
  uVar15 = 1;
  if (9 < uVar14) {
    uVar11 = uVar14;
    uVar7 = 4;
    do {
      uVar15 = uVar7;
      if (uVar11 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_00102be4;
      }
      if (uVar11 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_00102be4;
      }
      if (uVar11 < 10000) goto LAB_00102be4;
      bVar5 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      uVar7 = uVar15 + 4;
    } while (bVar5);
    uVar15 = uVar15 + 1;
  }
LAB_00102be4:
  std::__cxx11::string::_M_construct
            ((ulong)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (char)uVar15 - (char)((long)uVar12 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi - ((long)uVar12 >> 0x3f)),uVar15,uVar14);
  plVar8 = (long *)std::__cxx11::string::replace
                             ((ulong)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount,0,(char *)0x0,0x10403a);
  plVar10 = plVar8 + 2;
  if ((long *)*plVar8 == plVar10) {
    local_40 = *plVar10;
    lStack_38 = plVar8[3];
    __str.field_2._8_8_ = &local_40;
  }
  else {
    local_40 = *plVar10;
    __str.field_2._8_8_ = (long *)*plVar8;
  }
  lVar3 = plVar8[1];
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)__str.field_2._8_8_,lVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if ((long *)__str.field_2._8_8_ != &local_40) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  if (myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__str._M_string_length) {
    operator_delete(myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = (ulong)((myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_Auto).noOfPassengers;
  }
  uVar14 = -uVar12;
  if (0 < (long)uVar12) {
    uVar14 = uVar12;
  }
  uVar15 = 1;
  if (9 < uVar14) {
    uVar11 = uVar14;
    uVar7 = 4;
    do {
      uVar15 = uVar7;
      if (uVar11 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_00102d48;
      }
      if (uVar11 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_00102d48;
      }
      if (uVar11 < 10000) goto LAB_00102d48;
      bVar5 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      uVar7 = uVar15 + 4;
    } while (bVar5);
    uVar15 = uVar15 + 1;
  }
LAB_00102d48:
  myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__str._M_string_length;
  std::__cxx11::string::_M_construct
            ((ulong)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (char)uVar15 - (char)((long)uVar12 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi - ((long)uVar12 >> 0x3f)),uVar15,uVar14);
  plVar8 = (long *)std::__cxx11::string::replace
                             ((ulong)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount,0,(char *)0x0,0x10403a);
  plVar10 = plVar8 + 2;
  if ((long *)*plVar8 == plVar10) {
    local_40 = *plVar10;
    lStack_38 = plVar8[3];
    __str.field_2._8_8_ = &local_40;
  }
  else {
    local_40 = *plVar10;
    __str.field_2._8_8_ = (long *)*plVar8;
  }
  lVar3 = plVar8[1];
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)__str.field_2._8_8_,lVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if ((long *)__str.field_2._8_8_ != &local_40) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  if (myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__str._M_string_length) {
    operator_delete(myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=======   Separator  ======== ",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>::~vector
            ((vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_> *)auStack_b8);
  if (myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {

	// Create 3 Objects
	// No deletes and no new operators are used.

	// This is my Auto.
	auto myAuto = std::make_shared<SedanCar>();
	myAuto->setNoOfPassengers(4);
	myAuto->setTailLoad(double(101.5));

	std::cout
			<< "Total weight of my Sedan Car is: "
					+ std::to_string(myAuto->getTotalWeight()) << std::endl;
	std::cout << "No of References : " + std::to_string(myAuto.use_count())
			<< std::endl;
	std::cout << "=======   Separator  ======== " << std::endl;

	// And this is my truck.
	auto myTruck = std::make_shared<Truck>();
	myTruck->setNoOfPassengers(2);
	myTruck->setTailLoad(double(500.50));

	std::cout
			<< "Total weight of my Truck Car is: "
					+ std::to_string(myTruck->getTotalWeight()) << std::endl;

	std::cout << "No of References : " + std::to_string(myTruck.use_count())
			<< std::endl;

	std::cout << "=======   Separator  ======== " << std::endl;

	// Now let us make a vector of my cars.
	std::vector<AutoPtr> cars;
	cars.push_back(myAuto);
	cars.push_back(myTruck);

	double totalWeight = 0;

	for (AutoPtr c : cars) {
		totalWeight += c->getTotalWeight();
	}

	std::cout << "Total weight of my cars are: ";
	std::cout << +totalWeight << std::endl;

	std::cout << "=======   Separator  ======== " << std::endl;

	std::cout
			<< "Now Objects have no references and are removed from memory automatically."
			<< std::endl;

	std::cout << "=======   Separator  ======== " << std::endl;

	std::cout << "No of References : " + std::to_string(myAuto.use_count())
			<< std::endl;
	std::cout << "No of References : " + std::to_string(myTruck.use_count())
			<< std::endl;


	// No need to do the delete operations
	// Objects will be reference counted.

// Running Valgrind as test

// $ valgrind -v ./Example-1
//     ==4516==
//     ==4516== HEAP SUMMARY:
//     ==4516==     in use at exit: 0 bytes in 0 blocks
//     ==4516==   total heap usage: 6 allocs, 6 frees, 73,888 bytes allocated
//     ==4516==
//     ==4516== All heap blocks were freed -- no leaks are possible
//     ==4516==
//     ==4516== ERROR SUMMARY: 0 errors from 0 contexts (suppressed: 0 from 0)
//     ==4516== ERROR SUMMARY: 0 errors from 0 contexts (suppressed: 0 from 0)


	std::cout << "=======   Separator  ======== " << std::endl;

	return 0;
}